

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpUtils.cpp
# Opt level: O1

void getSubVectorsTranspose
               (HighsIndexCollection *index_collection,HighsInt data_dim,double *data0,double *data1
               ,double *data2,HighsSparseMatrix *matrix,HighsInt *num_sub_vector,
               double *sub_vector_data0,double *sub_vector_data1,double *sub_vector_data2,
               HighsInt *sub_matrix_num_nz,HighsInt *sub_matrix_start,HighsInt *sub_matrix_index,
               double *sub_matrix_value)

{
  pointer piVar1;
  pointer piVar2;
  pointer pdVar3;
  bool bVar4;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  vector<int,_std::allocator<int>_> sub_matrix_length;
  HighsInt local_b0;
  int local_ac;
  HighsInt local_a8 [2];
  int local_a0;
  int local_9c;
  ulong local_98;
  int local_8c;
  vector<int,_std::allocator<int>_> local_88;
  vector<int,_std::allocator<int>_> local_68;
  HighsSparseMatrix *local_48;
  double *local_40;
  value_type_conflict2 local_34;
  
  uVar9 = (ulong)(uint)data_dim;
  local_48 = matrix;
  local_40 = data2;
  limits(index_collection,&local_9c,&local_a0);
  local_b0 = -1;
  local_a8[1] = 0;
  local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::resize(&local_88,(long)data_dim);
  *num_sub_vector = 0;
  *sub_matrix_num_nz = 0;
  local_98 = uVar9;
  if (index_collection->is_mask_ == true) {
    if (0 < data_dim) {
      piVar1 = (index_collection->mask_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar7 = 0;
      do {
        if (piVar1[uVar7] == 0) {
          local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar7] = -1;
        }
        else {
          local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar7] = *num_sub_vector;
          *num_sub_vector = *num_sub_vector + 1;
        }
        uVar7 = uVar7 + 1;
      } while (uVar9 != uVar7);
    }
  }
  else {
    local_a8[0] = -1;
    local_a8[1] = 0;
    if (local_9c <= local_a0) {
      iVar8 = local_9c;
      do {
        updateOutInIndex(index_collection,&local_ac,&local_b0,&local_8c,local_a8,local_a8 + 1);
        if ((iVar8 == local_9c) && (0 < local_ac)) {
          lVar10 = 0;
          do {
            local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[lVar10] = -1;
            lVar10 = lVar10 + 1;
          } while (lVar10 < local_ac);
        }
        if (local_ac <= local_b0) {
          lVar10 = (long)local_ac + -1;
          do {
            local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[lVar10 + 1] = *num_sub_vector;
            *num_sub_vector = *num_sub_vector + 1;
            lVar10 = lVar10 + 1;
          } while (lVar10 < local_b0);
        }
        if (local_8c <= local_a8[0]) {
          lVar10 = (long)local_8c + -1;
          do {
            local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[lVar10 + 1] = -1;
            lVar10 = lVar10 + 1;
          } while (lVar10 < local_a8[0]);
        }
      } while ((local_a8[0] < data_dim + -1) && (bVar4 = iVar8 < local_a0, iVar8 = iVar8 + 1, bVar4)
              );
    }
  }
  iVar8 = *num_sub_vector;
  if ((long)iVar8 != 0) {
    if (0 < (int)local_98) {
      uVar9 = 0;
      do {
        lVar10 = (long)local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar9];
        if (-1 < lVar10) {
          if (sub_vector_data0 != (double *)0x0) {
            sub_vector_data0[lVar10] = data0[uVar9];
          }
          if (sub_vector_data1 != (double *)0x0) {
            sub_vector_data1[lVar10] = data1[uVar9];
          }
          if (sub_vector_data2 != (double *)0x0) {
            sub_vector_data2[lVar10] = local_40[uVar9];
          }
        }
        uVar9 = uVar9 + 1;
      } while ((local_98 & 0xffffffff) != uVar9);
    }
    local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)0x0;
    local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_34 = 0;
    std::vector<int,_std::allocator<int>_>::_M_fill_assign(&local_68,(long)iVar8,&local_34);
    piVar1 = (local_48->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar5 = (int)((ulong)((long)(local_48->start_).super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_finish - (long)piVar1) >> 2) - 1;
    if (0 < (int)uVar5) {
      piVar2 = (local_48->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar9 = 0;
      do {
        lVar10 = (long)piVar1[uVar9];
        uVar7 = uVar9 + 1;
        if (piVar1[uVar9] < piVar1[uVar9 + 1]) {
          do {
            if (-1 < (long)local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[piVar2[lVar10]]) {
              local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start[local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[piVar2[lVar10]]] =
                   local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start
                   [local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[piVar2[lVar10]]] + 1;
            }
            lVar10 = lVar10 + 1;
          } while (lVar10 < piVar1[uVar7]);
        }
        uVar9 = uVar7;
      } while (uVar7 != uVar5);
    }
    if (sub_matrix_start == (HighsInt *)0x0) {
      if (0 < *num_sub_vector) {
        lVar10 = 0;
        do {
          *sub_matrix_num_nz =
               *sub_matrix_num_nz +
               local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[lVar10];
          lVar10 = lVar10 + 1;
        } while (lVar10 < *num_sub_vector);
      }
    }
    else {
      *sub_matrix_start = 0;
      if (*num_sub_vector < 2) {
        uVar9 = (ulong)(*num_sub_vector - 1);
      }
      else {
        lVar10 = 0;
        do {
          sub_matrix_start[lVar10 + 1] =
               local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[lVar10] + sub_matrix_start[lVar10];
          local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[lVar10] = sub_matrix_start[lVar10];
          lVar10 = lVar10 + 1;
          uVar9 = (long)*num_sub_vector - 1;
        } while (lVar10 < (long)uVar9);
      }
      iVar8 = (int)uVar9;
      *sub_matrix_num_nz =
           local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start[iVar8] + sub_matrix_start[iVar8];
      if ((sub_matrix_index != (HighsInt *)0x0 || sub_matrix_value != (double *)0x0) &&
         (local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[iVar8] = sub_matrix_start[iVar8], 0 < (int)uVar5)) {
        piVar2 = (local_48->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar9 = 0;
        do {
          lVar10 = (long)piVar1[uVar9];
          uVar7 = uVar9 + 1;
          if (piVar1[uVar9] < piVar1[uVar9 + 1]) {
            pdVar3 = (local_48->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            do {
              lVar6 = (long)local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start[piVar2[lVar10]];
              if (-1 < lVar6) {
                iVar8 = local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar6];
                if (sub_matrix_index != (HighsInt *)0x0) {
                  sub_matrix_index[iVar8] = (HighsInt)uVar9;
                }
                if (sub_matrix_value != (double *)0x0) {
                  sub_matrix_value[iVar8] = pdVar3[lVar10];
                }
                local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[lVar6] =
                     local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar6] + 1;
              }
              lVar10 = lVar10 + 1;
            } while (lVar10 < piVar1[uVar7]);
          }
          uVar9 = uVar7;
        } while (uVar7 != uVar5);
      }
    }
    if (local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  if (local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void getSubVectorsTranspose(const HighsIndexCollection& index_collection,
                            const HighsInt data_dim, const double* data0,
                            const double* data1, const double* data2,
                            const HighsSparseMatrix& matrix,
                            HighsInt& num_sub_vector, double* sub_vector_data0,
                            double* sub_vector_data1, double* sub_vector_data2,
                            HighsInt& sub_matrix_num_nz,
                            HighsInt* sub_matrix_start,
                            HighsInt* sub_matrix_index,
                            double* sub_matrix_value) {
  // Ensure that if there's no data0 then it's not required in the
  // sub-vector
  if (data0 == nullptr) assert(sub_vector_data0 == nullptr);
  assert(ok(index_collection));
  HighsInt from_k;
  HighsInt to_k;
  limits(index_collection, from_k, to_k);
  // Surely this is checked elsewhere
  assert(0 <= from_k && to_k < data_dim);
  assert(from_k <= to_k);
  // "Out" means not in the set to be extracted
  // "In" means in the set to be extracted
  HighsInt out_from_vector;
  HighsInt out_to_vector;
  HighsInt in_from_vector;
  HighsInt in_to_vector = -1;
  HighsInt current_set_entry = 0;
  // Set up a mask so that entries to be got from the matrix can be
  // identified and have their correct index.
  vector<HighsInt> new_index;
  new_index.resize(data_dim);

  num_sub_vector = 0;
  sub_matrix_num_nz = 0;
  if (!index_collection.is_mask_) {
    out_to_vector = -1;
    current_set_entry = 0;
    for (HighsInt k = from_k; k <= to_k; k++) {
      updateOutInIndex(index_collection, in_from_vector, in_to_vector,
                       out_from_vector, out_to_vector, current_set_entry);
      if (k == from_k) {
        // Account for any initial vectors not being extracted
        for (HighsInt iVector = 0; iVector < in_from_vector; iVector++) {
          new_index[iVector] = -1;
        }
      }
      for (HighsInt iVector = in_from_vector; iVector <= in_to_vector;
           iVector++) {
        new_index[iVector] = num_sub_vector;
        num_sub_vector++;
      }
      for (HighsInt iVector = out_from_vector; iVector <= out_to_vector;
           iVector++) {
        new_index[iVector] = -1;
      }
      if (out_to_vector >= data_dim - 1) break;
    }
  } else {
    for (HighsInt iVector = 0; iVector < data_dim; iVector++) {
      if (index_collection.mask_[iVector]) {
        new_index[iVector] = num_sub_vector;
        num_sub_vector++;
      } else {
        new_index[iVector] = -1;
      }
    }
  }

  // Bail out if no vectors are to be extracted
  if (num_sub_vector == 0) return;

  for (HighsInt iVector = 0; iVector < data_dim; iVector++) {
    HighsInt new_iVector = new_index[iVector];
    if (new_iVector >= 0) {
      assert(new_iVector < num_sub_vector);
      if (sub_vector_data0 != NULL)
        sub_vector_data0[new_iVector] = data0[iVector];
      if (sub_vector_data1 != NULL)
        sub_vector_data1[new_iVector] = data1[iVector];
      if (sub_vector_data2 != NULL)
        sub_vector_data2[new_iVector] = data2[iVector];
    }
  }
  const bool extract_start = sub_matrix_start != NULL;
  const bool extract_index = sub_matrix_index != NULL;
  const bool extract_value = sub_matrix_value != NULL;
  const bool extract_matrix = extract_index || extract_value;
  // Allocate an array of lengths for the sub-matrix to be
  // extracted: necessary even if just the number of nonzeros is
  // required
  vector<HighsInt> sub_matrix_length;
  sub_matrix_length.assign(num_sub_vector, 0);
  // Identify the lengths of the vectors in the sub-matrix to be extracted
  HighsInt num_vector = matrix.start_.size() - 1;
  for (HighsInt vector = 0; vector < num_vector; vector++) {
    for (HighsInt iEl = matrix.start_[vector]; iEl < matrix.start_[vector + 1];
         iEl++) {
      HighsInt iVector = matrix.index_[iEl];
      HighsInt new_iVector = new_index[iVector];
      if (new_iVector >= 0) sub_matrix_length[new_iVector]++;
    }
  }
  if (!extract_start) {
    // bail out if no matrix starts are to be extracted, but only after
    // computing the number of nonzeros
    for (HighsInt iVector = 0; iVector < num_sub_vector; iVector++)
      sub_matrix_num_nz += sub_matrix_length[iVector];
    return;
  }
  // Allocate an array of lengths for the sub-matrix to be extracted
  sub_matrix_start[0] = 0;
  for (HighsInt iVector = 0; iVector < num_sub_vector - 1; iVector++) {
    sub_matrix_start[iVector + 1] =
        sub_matrix_start[iVector] + sub_matrix_length[iVector];
    sub_matrix_length[iVector] = sub_matrix_start[iVector];
  }
  HighsInt iVector = num_sub_vector - 1;
  sub_matrix_num_nz = sub_matrix_start[iVector] + sub_matrix_length[iVector];
  // Bail out if matrix indices and values are not required
  if (!extract_matrix) return;
  sub_matrix_length[iVector] = sub_matrix_start[iVector];
  // Fill the row-wise matrix with indices and values
  for (HighsInt vector = 0; vector < num_vector; vector++) {
    for (HighsInt iEl = matrix.start_[vector]; iEl < matrix.start_[vector + 1];
         iEl++) {
      HighsInt iVector = matrix.index_[iEl];
      HighsInt new_iVector = new_index[iVector];
      if (new_iVector >= 0) {
        HighsInt row_iEl = sub_matrix_length[new_iVector];
        if (extract_index) sub_matrix_index[row_iEl] = vector;
        if (extract_value) sub_matrix_value[row_iEl] = matrix.value_[iEl];
        sub_matrix_length[new_iVector]++;
      }
    }
  }
}